

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O1

int queue_segment_get(uint32_t field,void *value,mixed_segment *segment)

{
  long *plVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  
  plVar1 = (long *)segment->data;
  if ((int)field < 0x25) {
    if (field == 1) {
      *(bool *)value = segment->mix == queue_segment_mix_bypass;
      return 1;
    }
    if (field != 0x24) {
LAB_001436fa:
      mixed_err(7);
      return 0;
    }
    uVar2 = (undefined4)plVar1[5];
  }
  else {
    if (field != 0x25) {
      if (field == 0x26) {
        if ((undefined8 *)*plVar1 == (undefined8 *)0x0) {
          uVar3 = 0;
        }
        else {
          uVar3 = *(undefined8 *)*plVar1;
        }
        *(undefined8 *)value = uVar3;
        return 1;
      }
      goto LAB_001436fa;
    }
    uVar2 = (undefined4)plVar1[3];
  }
  *(undefined4 *)value = uVar2;
  return 1;
}

Assistant:

int queue_segment_get(uint32_t field, void *value, struct mixed_segment *segment){
  struct queue_segment_data *data = (struct queue_segment_data *)segment->data;
  switch(field){
  case MIXED_BYPASS: *((bool *)value) = (segment->mix == queue_segment_mix_bypass); break;
  case MIXED_CURRENT_SEGMENT: *((struct mixed_segment **)value) = (data->queue)?data->queue[0]:0; break;
  case MIXED_IN_COUNT: *((uint32_t *)value) = data->in_count; break;
  case MIXED_OUT_COUNT: *((uint32_t *)value) = data->out_count; break;
  default: mixed_err(MIXED_INVALID_FIELD); return 0;
  }
  return 1;
}